

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

EnumVar * __thiscall
kratos::Generator::enum_var(Generator *this,string *var_name,shared_ptr<kratos::Enum> *enum_def)

{
  iterator iVar1;
  VarException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  IRNode *local_80;
  undefined1 local_78 [40];
  undefined1 local_50 [8];
  shared_ptr<kratos::EnumVar> p;
  allocator_type local_29;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
          ::find(&(this->vars_)._M_t,var_name);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->vars_)._M_t._M_impl.super__Rb_tree_header) {
    local_78._16_8_ = this;
    std::__shared_ptr<kratos::EnumVar,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<kratos::EnumVar>,kratos::Generator*,std::__cxx11::string_const&,std::shared_ptr<kratos::Enum>const&>
              ((__shared_ptr<kratos::EnumVar,(__gnu_cxx::_Lock_policy)2> *)local_50,
               (allocator<kratos::EnumVar> *)local_78,(Generator **)(local_78 + 0x10),var_name,
               enum_def);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::EnumVar>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                *)&this->vars_,var_name,(shared_ptr<kratos::EnumVar> *)local_50);
    if (p.super___shared_ptr<kratos::EnumVar,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 p.super___shared_ptr<kratos::EnumVar,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return (EnumVar *)local_50;
  }
  this_00 = (VarException *)__cxa_allocate_exception(0x10);
  local_78._16_8_ = (var_name->_M_dataplus)._M_p;
  local_78._24_8_ = var_name->_M_string_length;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0x12;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)(local_78 + 0x10);
  fmt::v7::detail::vformat_abi_cxx11_((string *)local_50,(detail *)0x23aa4f,format_str,args);
  get_var((Generator *)local_78,(string *)this);
  local_80 = (IRNode *)local_78._0_8_;
  __l._M_len = 1;
  __l._M_array = &local_80;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
             (local_78 + 0x10),__l,&local_29);
  VarException::VarException
            (this_00,(string *)local_50,
             (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
             (local_78 + 0x10));
  __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

EnumVar &Generator::enum_var(const std::string &var_name, const std::shared_ptr<Enum> &enum_def) {
    if (has_var(var_name))
        throw VarException(::format("{0} already exists", var_name), {get_var(var_name).get()});
    auto p = std::make_shared<EnumVar>(this, var_name, enum_def);
    vars_.emplace(var_name, p);
    return *p;
}